

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

bool __thiscall Js::JavascriptWeakMap::Delete(JavascriptWeakMap *this,RecyclableObject *key)

{
  code *pcVar1;
  BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar2;
  undefined4 *puVar3;
  WeakMapId local_38;
  byte local_2b;
  byte local_2a;
  TBValue local_29;
  bool inData;
  bool inSet;
  WeakMapKeyMap *pWStack_28;
  bool unused;
  WeakMapKeyMap *keyMap;
  RecyclableObject *key_local;
  JavascriptWeakMap *this_local;
  
  keyMap = (WeakMapKeyMap *)key;
  key_local = (RecyclableObject *)this;
  pWStack_28 = GetWeakMapKeyMapFromKey(this,key);
  if (pWStack_28 == (WeakMapKeyMap *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_29 = false;
    local_2a = JsUtil::
               SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
               ::TryGetValueAndRemove
                         (&(this->keySet).
                           super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                          ,(TBKey *)&keyMap,&local_29);
    this_00 = pWStack_28;
    local_38 = GetWeakMapId(this);
    local_2b = JsUtil::
               BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Remove(this_00,&local_38);
    if ((local_2a & 1) != local_2b) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                  ,0x14a,"(inSet == inData)","inSet == inData");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local._7_1_ = (bool)(local_2b & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool JavascriptWeakMap::Delete(RecyclableObject* key)
    {
        WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

        if (keyMap != nullptr)
        {
            bool unused = false;
            bool inSet = keySet.TryGetValueAndRemove(key, &unused);
            bool inData = keyMap->Remove(GetWeakMapId());
            Assert(inSet == inData);

            return inData;
        }

        return false;
    }